

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema.c
# Opt level: O3

int lys_features_change(lys_module *module,char *name,int op)

{
  lys_feature *plVar1;
  byte *pbVar2;
  byte bVar3;
  lys_feature *plVar4;
  byte bVar5;
  uint uVar6;
  int iVar7;
  LY_ERR *pLVar8;
  lys_module *plVar9;
  char *pcVar10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  int local_48;
  int local_44;
  uint local_3c;
  int local_38;
  bool local_31;
  
  if (name == (char *)0x0 || module == (lys_module *)0x0) {
    return 1;
  }
  if (*name != '\0') {
    local_31 = true;
    if (*name == '*') {
      local_31 = name[1] != '\0';
    }
    uVar12 = 0xffffffffffffffff;
    local_38 = 0;
    uVar6 = 0;
    do {
      do {
        plVar9 = module;
        if (uVar12 != 0xffffffffffffffff) {
          plVar9 = (lys_module *)module->inc[uVar12].submodule;
        }
        bVar3 = plVar9->features_size;
        local_3c = uVar6;
        if ((ulong)bVar3 != 0) {
          plVar4 = plVar9->features;
          uVar14 = 0;
          do {
            if ((local_31 == false) || (iVar7 = strcmp(plVar4[uVar14].name,name), iVar7 == 0)) {
              if (op == 0) {
                if ((plVar4[uVar14].flags >> 8 & 1) != 0) {
                  lys_features_disable_recursive(plVar4 + uVar14);
                  local_38 = local_38 + 1;
                }
              }
              else if ((plVar4[uVar14].flags >> 8 & 1) == 0) {
                plVar1 = plVar4 + uVar14;
                if (plVar4[uVar14].iffeature_size == '\0') {
                  bVar5 = 0;
                  uVar6 = 0;
                }
                else {
                  lVar13 = 0;
                  uVar11 = 0;
                  do {
                    iVar7 = resolve_iffeature((lys_iffeature *)
                                              ((long)&plVar1->iffeature->expr + lVar13));
                    if (iVar7 == 0) {
                      if (local_31 != false) {
                        pLVar8 = ly_errno_location();
                        *pLVar8 = LY_EINVAL;
                        pcVar10 = plVar1->name;
                        local_3c = (int)uVar11 + 1;
                        goto LAB_0015854e;
                      }
                      local_3c = (int)uVar11 + 1;
                      bVar5 = plVar1->iffeature_size;
                      local_44 = (int)uVar12;
                      local_48 = (int)uVar14;
                      break;
                    }
                    uVar11 = uVar11 + 1;
                    bVar5 = plVar1->iffeature_size;
                    lVar13 = lVar13 + 0x20;
                  } while (uVar11 < bVar5);
                  uVar6 = (uint)uVar11;
                }
                if (uVar6 == bVar5) {
                  pbVar2 = (byte *)((long)&plVar1->flags + 1);
                  *pbVar2 = *pbVar2 | 1;
                  local_38 = local_38 + 1;
                }
              }
              if (local_31 != false) {
                return 0;
              }
            }
            uVar14 = uVar14 + 1;
          } while (uVar14 != bVar3);
        }
        uVar12 = uVar12 + 1;
        uVar6 = local_3c;
      } while (uVar12 < module->inc_size);
      if (local_38 == 0) break;
      uVar12 = 0xffffffffffffffff;
      uVar6 = 0;
      local_38 = 0;
    } while (local_3c != 0);
    if (local_3c == 0) {
      return (uint)local_31;
    }
    pLVar8 = ly_errno_location();
    *pLVar8 = LY_EINVAL;
    if (local_44 != -1) {
      module = (lys_module *)module->inc[local_44].submodule;
    }
    pcVar10 = module->features[local_48].name;
LAB_0015854e:
    ly_log(LY_LLERR,"Feature \"%s\" is disabled by its %d. if-feature condition.",pcVar10,
           (ulong)local_3c);
  }
  return 1;
}

Assistant:

static int
lys_features_change(const struct lys_module *module, const char *name, int op)
{
    int all = 0;
    int i, j, k;
    int progress, faili, failj, failk;

    uint8_t fsize;
    struct lys_feature *f;

    if (!module || !name || !strlen(name)) {
        return EXIT_FAILURE;
    }

    if (!strcmp(name, "*")) {
        /* enable all */
        all = 1;
    }

    progress = failk = 1;
    while (progress && failk) {
        for (i = -1, failk = progress = 0; i < module->inc_size; i++) {
            if (i == -1) {
                fsize = module->features_size;
                f = module->features;
            } else {
                fsize = module->inc[i].submodule->features_size;
                f = module->inc[i].submodule->features;
            }

            for (j = 0; j < fsize; j++) {
                if (all || !strcmp(f[j].name, name)) {
                    if ((op && (f[j].flags & LYS_FENABLED)) || (!op && !(f[j].flags & LYS_FENABLED))) {
                        if (all) {
                            /* skip already set features */
                            continue;
                        } else {
                            /* feature already set correctly */
                            return EXIT_SUCCESS;
                        }
                    }

                    if (op) {
                        /* check referenced features if they are enabled */
                        for (k = 0; k < f[j].iffeature_size; k++) {
                            if (!resolve_iffeature(&f[j].iffeature[k])) {
                                if (all) {
                                    faili = i;
                                    failj = j;
                                    failk = k + 1;
                                    break;
                                } else {
                                    LOGERR(LY_EINVAL, "Feature \"%s\" is disabled by its %d. if-feature condition.",
                                           f[j].name, k + 1);
                                    return EXIT_FAILURE;
                                }
                            }
                        }

                        if (k == f[j].iffeature_size) {
                            /* the last check passed, do the change */
                            f[j].flags |= LYS_FENABLED;
                            progress++;
                        }
                    } else {
                        lys_features_disable_recursive(&f[j]);
                        progress++;
                    }
                    if (!all) {
                        /* stop in case changing a single feature */
                        return EXIT_SUCCESS;
                    }
                }
            }
        }
    }
    if (failk) {
        /* print info about the last failing feature */
        LOGERR(LY_EINVAL, "Feature \"%s\" is disabled by its %d. if-feature condition.",
               faili == -1 ? module->features[failj].name : module->inc[faili].submodule->features[failj].name, failk);
        return EXIT_FAILURE;
    }

    if (all) {
        return EXIT_SUCCESS;
    } else {
        /* the specified feature not found */
        return EXIT_FAILURE;
    }
}